

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * pugi::impl::anon_unknown_0::evaluate_node_set_prepare(xpath_query_impl *impl)

{
  xpath_value_type xVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  xpath_parse_result res;
  xpath_parse_result *in_stack_ffffffffffffffb8;
  xpath_exception *this;
  char *local_20 [2];
  undefined8 *local_10;
  xpath_ast_node *local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_8 = (xpath_ast_node *)0x0;
  }
  else {
    local_10 = in_RDI;
    xVar1 = xpath_ast_node::rettype((xpath_ast_node *)*in_RDI);
    if (xVar1 != xpath_type_node_set) {
      this = (xpath_exception *)local_20;
      xpath_parse_result::xpath_parse_result((xpath_parse_result *)this);
      local_20[0] = "Expression does not evaluate to node set";
      uVar2 = __cxa_allocate_exception(0x18);
      xpath_exception::xpath_exception(this,in_stack_ffffffffffffffb8);
      __cxa_throw(uVar2,&xpath_exception::typeinfo,xpath_exception::~xpath_exception);
    }
    local_8 = (xpath_ast_node *)*local_10;
  }
  return local_8;
}

Assistant:

PUGI__FN impl::xpath_ast_node* evaluate_node_set_prepare(xpath_query_impl* impl)
	{
		if (!impl) return 0;

		if (impl->root->rettype() != xpath_type_node_set)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return 0;
		#else
			xpath_parse_result res;
			res.error = "Expression does not evaluate to node set";

			throw xpath_exception(res);
		#endif
		}

		return impl->root;
	}